

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O2

int __thiscall CaDiCaL::Internal::backward_true_satisfiable(Internal *this)

{
  anon_struct_16_2_20cb3f79_for_constant_forward_backward *paVar1;
  bool bVar2;
  int res;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)this->max_var;
  while( true ) {
    if ((int)uVar3 < 1) {
      if (this->internal != (Internal *)0x0) {
        verbose(this->internal,1,"backward assuming variables true satisfies formula");
      }
      paVar1 = &(this->stats).lucky.backward;
      paVar1->one = paVar1->one + 1;
      return 10;
    }
    bVar2 = terminated_asynchronously(this,10);
    if (bVar2) break;
    if (this->vals[uVar3] == '\0') {
      search_assume_decision(this,(int)uVar3);
      bVar2 = propagate(this);
      if (!bVar2) {
        res = 0;
        goto LAB_0066557f;
      }
    }
    uVar3 = uVar3 - 1;
  }
  res = -1;
LAB_0066557f:
  unlucky(this,res);
  return res;
}

Assistant:

int Internal::backward_true_satisfiable () {
  LOG ("checking decreasing variable index true assignment");
  assert (!unsat);
  assert (!level);
  assert (assumptions.empty ());
  for (int idx = max_var; idx > 0; idx--) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (!propagate ())
      return unlucky (0);
  }
  VERBOSE (1, "backward assuming variables true satisfies formula");
  assert (satisfied ());
  stats.lucky.backward.one++;
  return 10;
}